

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall r_exec::View::set(View *this,uint16_t member_index,double value)

{
  undefined6 in_register_00000032;
  float fVar1;
  
  switch((int)CONCAT62(in_register_00000032,member_index)) {
  case 3:
    fVar1 = (float)r_code::Atom::asFloat();
    this->acc_sln = (float)((double)this->acc_sln + (value - (double)fVar1));
    this->sln_changes = this->sln_changes + 1;
    break;
  case 4:
    set_res(this,value);
    return;
  case 7:
    fVar1 = (float)r_code::Atom::asFloat();
    this->acc_act = (float)((double)this->acc_act + (value - (double)fVar1));
    this->act_changes = this->act_changes + 1;
    break;
  case 8:
    fVar1 = (float)r_code::Atom::asFloat();
    this->acc_vis = (float)((double)this->acc_vis + (value - (double)fVar1));
    this->vis_changes = this->vis_changes + 1;
  }
  return;
}

Assistant:

void View::set(uint16_t member_index, double value)
{
    switch (member_index) {
    case VIEW_SLN:
        set_sln(value);
        break;

    case VIEW_RES:
        set_res(value);
        break;

    case VIEW_ACT:
        set_act(value);
        break;

    case GRP_VIEW_VIS:
        set_vis(value);
        break;
    }
}